

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

bool Process::setEnvironmentVariable(String *name,String *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__value;
  String *value_local;
  String *name_local;
  
  bVar1 = String::isEmpty(value);
  if (bVar1) {
    pcVar3 = String::operator_cast_to_char_(name);
    iVar2 = unsetenv(pcVar3);
    name_local._7_1_ = iVar2 != 0;
  }
  else {
    pcVar3 = String::operator_cast_to_char_(name);
    __value = String::operator_cast_to_char_(value);
    iVar2 = setenv(pcVar3,__value,1);
    name_local._7_1_ = iVar2 == 0;
  }
  return name_local._7_1_;
}

Assistant:

bool Process::setEnvironmentVariable(const String& name, const String& value)
{
#ifdef _WIN32
  return SetEnvironmentVariable((const char*)name, value.isEmpty() ? 0 : (const char*)value) == TRUE;
#else
  if(value.isEmpty())
    return unsetenv((const char*)name);
  return setenv((const char*)name, (const char*)value, 1) == 0;
#endif
}